

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O2

void __thiscall icu_63::LocDataParser::parseError(LocDataParser *this,char *param_1)

{
  UChar *pUVar1;
  UParseError *pUVar2;
  UChar *pUVar3;
  UChar *pUVar4;
  UChar *pUVar5;
  UChar *pUVar6;
  
  pUVar5 = this->data;
  if (pUVar5 != (UChar *)0x0) {
    pUVar1 = this->p;
    pUVar6 = pUVar1;
    pUVar4 = pUVar1 + -0x11;
    if (pUVar1 + -0x11 < pUVar5) {
      pUVar4 = pUVar5;
    }
    do {
      pUVar3 = pUVar6 + -1;
      pUVar5 = pUVar4;
      if (pUVar3 < pUVar4) break;
      pUVar5 = pUVar6;
      pUVar6 = pUVar3;
    } while (*pUVar3 != L'\0');
    pUVar6 = pUVar1 + 0xf;
    if (this->e < pUVar1 + 0xf) {
      pUVar6 = this->e;
    }
    u_strncpy_63(this->pe->preContext,pUVar5,(int32_t)((ulong)((long)pUVar1 - (long)pUVar5) >> 1));
    pUVar1 = this->p;
    pUVar2 = this->pe;
    *(undefined2 *)((long)pUVar2 + (long)pUVar1 + (8 - (long)pUVar5)) = 0;
    u_strncpy_63(pUVar2->postContext,pUVar1,(int32_t)((ulong)((long)pUVar6 - (long)pUVar1) >> 1));
    pUVar5 = this->p;
    pUVar2 = this->pe;
    *(undefined2 *)((long)pUVar2 + (long)pUVar6 + (0x28 - (long)pUVar5)) = 0;
    pUVar1 = this->data;
    pUVar2->offset = (int32_t)((ulong)((long)pUVar5 - (long)pUVar1) >> 1);
    uprv_free_63(pUVar1);
    this->p = (UChar *)0x0;
    this->data = (UChar *)0x0;
    this->e = (UChar *)0x0;
    if (*this->ec < U_ILLEGAL_ARGUMENT_ERROR) {
      *this->ec = U_PARSE_ERROR;
    }
  }
  return;
}

Assistant:

void LocDataParser::parseError(const char* EXPLANATION_ARG)
{
    if (!data) {
        return;
    }

    const UChar* start = p - U_PARSE_CONTEXT_LEN - 1;
    if (start < data) {
        start = data;
    }
    for (UChar* x = p; --x >= start;) {
        if (!*x) {
            start = x+1;
            break;
        }
    }
    const UChar* limit = p + U_PARSE_CONTEXT_LEN - 1;
    if (limit > e) {
        limit = e;
    }
    u_strncpy(pe.preContext, start, (int32_t)(p-start));
    pe.preContext[p-start] = 0;
    u_strncpy(pe.postContext, p, (int32_t)(limit-p));
    pe.postContext[limit-p] = 0;
    pe.offset = (int32_t)(p - data);
    
#ifdef RBNF_DEBUG
    fprintf(stderr, "%s at or near character %ld: ", EXPLANATION_ARG, p-data);

    UnicodeString msg;
    msg.append(start, p - start);
    msg.append((UChar)0x002f); /* SOLIDUS/SLASH */
    msg.append(p, limit-p);
    msg.append(UNICODE_STRING_SIMPLE("'"));
    
    char buf[128];
    int32_t len = msg.extract(0, msg.length(), buf, 128);
    if (len >= 128) {
        buf[127] = 0;
    } else {
        buf[len] = 0;
    }
    fprintf(stderr, "%s\n", buf);
    fflush(stderr);
#endif
    
    uprv_free(data);
    data = NULL;
    p = NULL;
    e = NULL;
    
    if (U_SUCCESS(ec)) {
        ec = U_PARSE_ERROR;
    }
}